

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::Eval
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  JobManager *this_00;
  string *psVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *this_01;
  bool bVar8;
  Status SVar9;
  ssize_t sVar10;
  const_iterator cVar11;
  char *pcVar12;
  Value *pVVar13;
  char *pcVar14;
  int iVar15;
  Interpreter *pIVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  uint64_t xpan;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  Expression retExpr;
  writer write;
  int cancelData;
  undefined1 local_2d8 [32];
  format_string_checker<char> *local_2b8;
  parse_func local_2b0 [1];
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  undefined1 local_290 [8];
  char local_288 [16];
  _Alloc_hider local_278;
  pointer local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  string local_258;
  pointer local_238;
  pointer local_230;
  Expression local_228;
  _Alloc_hider local_208 [3];
  undefined1 local_1ec [4];
  ErrorCode local_1e8;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  ErrorCode local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  ErrorCode local_198;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  ErrorCode local_170;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  ErrorCode local_148;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  ErrorCode local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  ErrorCode local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  ErrorCode local_d0;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  Error local_a8;
  Error local_80;
  Error local_58;
  
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mError).mCode = kNone;
  local_238 = &(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_230 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  LOCK();
  (this->mCancelCommand)._M_base._M_i = false;
  UNLOCK();
  do {
    sVar10 = read(this->mCancelPipe[0],local_1ec,4);
    this_01 = mEvaluatorMap_abi_cxx11_;
  } while (sVar10 != -1);
  utils::ToLower((string *)local_2a0,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
           ::find(this_01,(key_type *)local_2a0);
  if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_290) {
    operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
  }
  if ((_Rb_tree_header *)cVar11._M_node ==
      &(mEvaluatorMap_abi_cxx11_->_M_impl).super__Rb_tree_header) {
    local_2d8._0_4_ = 0xd;
    pcVar12 = "\'{}\' is not a valid command, type \'help\' to list all commands";
    local_2d8._8_8_ = "\'{}\' is not a valid command, type \'help\' to list all commands";
    local_2d8._16_8_ = 0x3d;
    local_2d8._24_8_ = 0x100000000;
    local_2b0[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_2b8 = (format_string_checker<char> *)local_2d8;
    local_208[0]._M_p = (pointer)local_2d8;
    do {
      cVar1 = *pcVar12;
      pcVar14 = pcVar12;
      while (cVar1 != '{') {
        pcVar14 = pcVar14 + 1;
        if (pcVar14 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_208,pcVar12,"");
          goto LAB_001c82b5;
        }
        cVar1 = *pcVar14;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)local_208,pcVar12,pcVar14);
      pcVar12 = ::fmt::v10::detail::
                parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                          (pcVar14,"",(format_string_checker<char> *)local_2d8);
    } while (pcVar12 != "");
LAB_001c82b5:
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_2d8._0_8_ = (pbVar3->_M_dataplus)._M_p;
    local_2d8._8_8_ = pbVar3->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x3d;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_2d8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_258,(v10 *)"\'{}\' is not a valid command, type \'help\' to list all commands"
               ,fmt,args_00);
    local_d0 = kInvalidCommand;
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_258._M_dataplus._M_p,
               local_258._M_dataplus._M_p + (long)(_Alloc_hider *)local_258._M_string_length);
    local_2a0._0_4_ = local_d0;
    local_298._M_p = local_288;
    std::__cxx11::string::_M_construct<char*>((string *)&local_298,local_c8,local_c8 + local_c0);
    local_270 = (pointer)0x0;
    local_268._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
    local_278._M_p = (pointer)&local_268;
    std::__cxx11::string::operator=((string *)local_238,(string *)&local_298);
    std::__cxx11::string::operator=((string *)local_230,(string *)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p);
    }
    if (local_298._M_p != local_288) {
      operator_delete(local_298._M_p);
    }
    puVar17 = local_c8;
    if (local_c8 != local_b8) {
LAB_001c83bb:
      operator_delete(puVar17);
    }
LAB_001c83c0:
    psVar7 = &local_258;
LAB_001c83c8:
    puVar17 = (undefined1 *)(&(psVar7->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17 != &psVar7->field_2) {
      operator_delete(puVar17);
    }
  }
  else {
    MultiNetCommandContext::Cleanup(&this->mContext);
    ReParseMultiNetworkSyntax(&local_58,this,aExpr,&local_228);
    local_2a0._0_4_ = local_58.mCode;
    local_298._M_p = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_58.mMessage._M_dataplus._M_p,
               local_58.mMessage._M_dataplus._M_p + local_58.mMessage._M_string_length);
    local_270 = (pointer)0x0;
    local_268._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
    local_278._M_p = (pointer)&local_268;
    std::__cxx11::string::operator=((string *)local_238,(string *)&local_298);
    std::__cxx11::string::operator=((string *)local_230,(string *)&local_278);
    EVar2 = (__return_storage_ptr__->mError).mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p);
    }
    if (local_298._M_p != local_288) {
      operator_delete(local_298._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
      operator_delete(local_58.mMessage._M_dataplus._M_p);
    }
    if (EVar2 == kNone) {
      pbVar3 = (this->mContext).mExportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (this->mContext).mExportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (0x20 < (ulong)((long)pbVar4 - (long)pbVar3)) {
        local_2d8._0_8_ = (ulong)(uint)local_2d8._4_4_ << 0x20;
        pcVar12 = "multiple files not allowed for --export";
        local_2d8._8_8_ = "multiple files not allowed for --export";
        local_2d8._16_8_ = 0x27;
        local_2d8._24_8_ = 0;
        local_2b0[0] = (parse_func)0x0;
        local_2b8 = (format_string_checker<char> *)local_2d8;
        local_208[0]._M_p = (pointer)local_2d8;
        do {
          cVar1 = *pcVar12;
          pcVar14 = pcVar12;
          while (cVar1 != '{') {
            pcVar14 = pcVar14 + 1;
            if (pcVar14 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)local_208,pcVar12,"");
              goto LAB_001c8499;
            }
            cVar1 = *pcVar14;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_208,pcVar12,pcVar14);
          pcVar12 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar14,"",(format_string_checker<char> *)local_2d8);
        } while (pcVar12 != "");
LAB_001c8499:
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_2d8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_258,(v10 *)"multiple files not allowed for --export",
                   (string_view)ZEXT816(0x27),args_01);
        local_f8 = kInvalidArgs;
        puVar18 = local_e0;
        local_f0 = puVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_258._M_dataplus._M_p,
                   local_258._M_dataplus._M_p + (long)(_Alloc_hider *)local_258._M_string_length);
        local_2a0._0_4_ = local_f8;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>((string *)&local_298,local_f0,local_f0 + local_e8)
        ;
        local_270 = (pointer)0x0;
        local_268._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
        local_278._M_p = (pointer)&local_268;
        std::__cxx11::string::operator=((string *)local_238,(string *)&local_298);
        std::__cxx11::string::operator=((string *)local_230,(string *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p);
        }
        puVar17 = local_f0;
        if (local_298._M_p != local_288) {
          operator_delete(local_298._M_p);
          puVar17 = local_f0;
        }
LAB_001c8710:
        if (puVar17 != puVar18) goto LAB_001c83bb;
        goto LAB_001c83c0;
      }
      pbVar5 = (this->mContext).mImportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (this->mContext).mImportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pIVar16 = (Interpreter *)((long)pbVar6 - (long)pbVar5);
      if ((Interpreter *)0x20 < pIVar16) {
        local_2d8._0_8_ = (ulong)(uint)local_2d8._4_4_ << 0x20;
        pcVar12 = "multiple files not allowed for --import";
        local_2d8._8_8_ = "multiple files not allowed for --import";
        local_2d8._16_8_ = 0x27;
        local_2d8._24_8_ = 0;
        local_2b0[0] = (parse_func)0x0;
        local_2b8 = (format_string_checker<char> *)local_2d8;
        local_208[0]._M_p = (pointer)local_2d8;
        do {
          cVar1 = *pcVar12;
          pcVar14 = pcVar12;
          while (cVar1 != '{') {
            pcVar14 = pcVar14 + 1;
            if (pcVar14 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)local_208,pcVar12,"");
              goto LAB_001c8622;
            }
            cVar1 = *pcVar14;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_208,pcVar12,pcVar14);
          pcVar12 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar14,"",(format_string_checker<char> *)local_2d8);
        } while (pcVar12 != "");
LAB_001c8622:
        args_02.field_1.args_ = in_R9.args_;
        args_02.desc_ = (unsigned_long_long)local_2d8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_258,(v10 *)"multiple files not allowed for --import",
                   (string_view)ZEXT816(0x27),args_02);
        local_120 = kInvalidArgs;
        puVar18 = local_108;
        local_118 = puVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_258._M_dataplus._M_p,
                   local_258._M_dataplus._M_p + (long)(_Alloc_hider *)local_258._M_string_length);
        local_2a0._0_4_ = local_120;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_118,local_118 + local_110);
        local_270 = (pointer)0x0;
        local_268._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
        local_278._M_p = (pointer)&local_268;
        std::__cxx11::string::operator=((string *)local_238,(string *)&local_298);
        std::__cxx11::string::operator=((string *)local_230,(string *)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p);
        }
        puVar17 = local_118;
        if (local_298._M_p != local_288) {
          operator_delete(local_298._M_p);
          puVar17 = local_118;
        }
        goto LAB_001c8710;
      }
      if (pbVar4 == pbVar3) {
        if (pbVar6 == pbVar5) {
LAB_001c89af:
          if (((this->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
               (this->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) &&
             ((this->mContext).mDomAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->mContext).mDomAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
            if ((this->mContext).mImportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->mContext).mImportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              local_2d8._0_8_ = (Interpreter *)0x0;
              SVar9 = persistent_storage::Registry::GetCurrentNetworkXpan
                                ((this->mRegistry).
                                 super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,(uint64_t *)local_2d8);
              if (SVar9 != kSuccess) {
                local_2d8._0_8_ = (Interpreter *)0x0;
              }
              JobManager::AppendImport
                        (&local_a8,
                         (this->mJobManager).
                         super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_2d8._0_8_,&local_228);
              local_2a0._0_4_ = local_a8.mCode;
              local_298._M_p = local_288;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_298,local_a8.mMessage._M_dataplus._M_p,
                         local_a8.mMessage._M_dataplus._M_p + local_a8.mMessage._M_string_length);
              local_270 = (pointer)0x0;
              local_268._M_local_buf[0] = '\0';
              local_278._M_p = (pointer)&local_268;
              pVVar13 = Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
              EVar2 = (pVVar13->mError).mCode;
              Value::~Value((Value *)local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8.mMessage._M_dataplus._M_p != &local_a8.mMessage.field_2) {
                operator_delete(local_a8.mMessage._M_dataplus._M_p);
              }
              if (EVar2 != kNone) goto LAB_001c83d6;
            }
            if (cVar11._M_node[2]._M_left == (_Base_ptr)0x0) {
              local_2d8._0_8_ = this;
              std::__throw_bad_function_call();
            }
            local_2d8._0_8_ = this;
            (*(code *)cVar11._M_node[2]._M_right)(local_2a0,cVar11._M_node + 2,local_2d8,&local_228)
            ;
            Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
            Value::~Value((Value *)local_2a0);
            goto LAB_001c83d6;
          }
          local_258._M_dataplus._M_p = (char *)0x0;
          local_258._M_string_length = 0;
          local_258.field_2._M_allocated_capacity = 0;
          ValidateMultiNetworkSyntax
                    ((Value *)local_2a0,this,&local_228,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_258);
          pIVar16 = (Interpreter *)local_2a0;
          pVVar13 = Value::operator=(__return_storage_ptr__,(Value *)pIVar16);
          EVar2 = (pVVar13->mError).mCode;
          Value::~Value((Value *)pIVar16);
          iVar15 = 6;
          if (EVar2 == kNone) {
            bVar8 = IsFeatureSupported(pIVar16,mMultiJobExecution_abi_cxx11_,&local_228);
            if (bVar8) {
              this_00 = (this->mJobManager).
                        super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              bVar8 = MultiNetCommandContext::HasGroupAlias(&this->mContext);
              JobManager::PrepareJobs
                        (&local_80,this_00,&local_228,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_258,bVar8);
              local_2a0._0_4_ = local_80.mCode;
              local_298._M_p = local_288;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_298,local_80.mMessage._M_dataplus._M_p,
                         local_80.mMessage._M_dataplus._M_p + local_80.mMessage._M_string_length);
              local_270 = (pointer)0x0;
              local_268._M_local_buf[0] = '\0';
              local_278._M_p = (pointer)&local_268;
              pVVar13 = Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
              EVar2 = (pVVar13->mError).mCode;
              Value::~Value((Value *)local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80.mMessage._M_dataplus._M_p != &local_80.mMessage.field_2) {
                operator_delete(local_80.mMessage._M_dataplus._M_p);
              }
              if (EVar2 == kNone) {
                JobManager::RunJobs((this->mJobManager).
                                    super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
                JobManager::CollectJobsValue
                          ((Value *)local_2a0,
                           (this->mJobManager).
                           super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
LAB_001c8c78:
                Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
                Value::~Value((Value *)local_2a0);
                iVar15 = 0;
              }
            }
            else {
              if ((this->mContext).mImportFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  (this->mContext).mImportFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                if (cVar11._M_node[2]._M_left == (_Base_ptr)0x0) {
                  local_2d8._0_8_ = this;
                  std::__throw_bad_function_call();
                }
                local_2d8._0_8_ = this;
                (*(code *)cVar11._M_node[2]._M_right)
                          (local_2a0,cVar11._M_node + 2,local_2d8,&local_228);
                goto LAB_001c8c78;
              }
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_06.field_1.args_ = in_R9.args_;
              args_06.desc_ = (unsigned_long_long)local_208;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_2d8,
                         (v10 *)
                         "Import syntax is not supported in synchronous processing of multi-network command"
                         ,(string_view)ZEXT816(0x51),args_06);
              local_1e8 = kInvalidArgs;
              local_1e0 = local_1d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e0,local_2d8._0_8_,
                         (char *)(local_2d8._8_8_ + local_2d8._0_8_));
              local_2a0._0_4_ = local_1e8;
              local_298._M_p = local_288;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_298,local_1e0,local_1e0 + local_1d8);
              local_270 = (pointer)0x0;
              local_268._M_local_buf[0] = '\0';
              local_278._M_p = (pointer)&local_268;
              Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
              Value::~Value((Value *)local_2a0);
              if (local_1e0 != local_1d0) {
                operator_delete(local_1e0);
              }
              if ((Interpreter *)local_2d8._0_8_ != (Interpreter *)(local_2d8 + 0x10)) {
                operator_delete((void *)local_2d8._0_8_);
              }
            }
          }
          if (local_258._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          if ((iVar15 != 0) && (iVar15 != 6)) {
            Value::~Value(__return_storage_ptr__);
            goto LAB_001c83df;
          }
          goto LAB_001c83d6;
        }
        bVar8 = IsFeatureSupported(pIVar16,mImportSyntax_abi_cxx11_,&local_228);
        if (bVar8) {
          if ((this->mContext).mExportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->mContext).mExportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            JobManager::SetImportFile
                      ((this->mJobManager).
                       super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(this->mContext).mImportFiles.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            goto LAB_001c89af;
          }
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)&local_258;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_2d8,(v10 *)"--export and --import are mutually exclusive",
                     (string_view)ZEXT816(0x2c),args_03);
          local_1c0 = kInvalidArgs;
          puVar17 = local_1a8;
          local_1b8 = puVar17;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_2d8._0_8_,
                     (char *)(local_2d8._8_8_ + local_2d8._0_8_));
          local_2a0._0_4_ = local_1c0;
          local_298._M_p = local_288;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_1b8,local_1b8 + local_1b0);
          local_270 = (pointer)0x0;
          local_268._M_local_buf[0] = '\0';
          local_278._M_p = (pointer)&local_268;
          Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
          Value::~Value((Value *)local_2a0);
          puVar18 = local_1b8;
        }
        else {
          ::fmt::v10::detail::check_format_string<const_char_(&)[9],_FMT_COMPILE_STRING,_0>();
          local_258._M_dataplus._M_p = "--import";
          fmt_01.size_ = 0xc;
          fmt_01.data_ = (char *)0x24;
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)&local_258;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_2d8,(v10 *)"\'{}\' is not supported by the command",fmt_01,
                     args_05);
          local_198 = kInvalidArgs;
          puVar17 = local_180;
          local_190 = puVar17;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,local_2d8._0_8_,
                     (char *)(local_2d8._8_8_ + local_2d8._0_8_));
          local_2a0._0_4_ = local_198;
          local_298._M_p = local_288;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_190,local_190 + local_188);
          local_270 = (pointer)0x0;
          local_268._M_local_buf[0] = '\0';
          local_278._M_p = (pointer)&local_268;
          Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
          Value::~Value((Value *)local_2a0);
          puVar18 = local_190;
        }
      }
      else {
        bVar8 = IsFeatureSupported(pIVar16,mExportSyntax_abi_cxx11_,&local_228);
        if (bVar8) {
          if ((this->mContext).mImportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->mContext).mImportFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) goto LAB_001c89af;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)&local_258;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_2d8,(v10 *)"--export and --import are mutually exclusive",
                     (string_view)ZEXT816(0x2c),args);
          local_170 = kInvalidArgs;
          puVar17 = local_158;
          local_168 = puVar17;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_2d8._0_8_,
                     (char *)(local_2d8._8_8_ + local_2d8._0_8_));
          local_2a0._0_4_ = local_170;
          local_298._M_p = local_288;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_168,local_168 + local_160);
          local_270 = (pointer)0x0;
          local_268._M_local_buf[0] = '\0';
          local_278._M_p = (pointer)&local_268;
          Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
          Value::~Value((Value *)local_2a0);
          puVar18 = local_168;
        }
        else {
          ::fmt::v10::detail::check_format_string<const_char_(&)[9],_FMT_COMPILE_STRING,_0>();
          local_258._M_dataplus._M_p = "--export";
          fmt_00.size_ = 0xc;
          fmt_00.data_ = (char *)0x24;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&local_258;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_2d8,(v10 *)"\'{}\' is not supported by the command",fmt_00,
                     args_04);
          local_148 = kInvalidArgs;
          puVar17 = local_130;
          local_140 = puVar17;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_2d8._0_8_,
                     (char *)(local_2d8._8_8_ + local_2d8._0_8_));
          local_2a0._0_4_ = local_148;
          local_298._M_p = local_288;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_140,local_140 + local_138);
          local_270 = (pointer)0x0;
          local_268._M_local_buf[0] = '\0';
          local_278._M_p = (pointer)&local_268;
          Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
          Value::~Value((Value *)local_2a0);
          puVar18 = local_140;
        }
      }
      if (puVar18 != puVar17) {
        operator_delete(puVar18);
      }
      psVar7 = (string *)local_2d8;
      goto LAB_001c83c8;
    }
  }
LAB_001c83d6:
  JobManager::CleanupJobs
            ((this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
LAB_001c83df:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::Eval(const Expression &aExpr)
{
    Expression retExpr;
    bool       supported;
    Value      value;
    int        cancelData;

    mCancelCommand = false;
    // empty the pipe prior to starting command execution
    while (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) != -1)
        ;

    // make sure first the command is known
    auto evaluator = mEvaluatorMap.find(ToLower(aExpr.front()));
    if (evaluator == mEvaluatorMap.end())
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_COMMAND, aExpr.front()));
    }
    // prepare for parsing next command
    mContext.Cleanup();

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));

    if (mContext.mExportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mExportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_EXPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mImportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
    }
    else if (mContext.mImportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mImportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_IMPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mExportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
        // let job manager take care of import data
        mJobManager->SetImportFile(mContext.mImportFiles.front());
    }

    if (mContext.mNwkAliases.size() > 0 || mContext.mDomAliases.size() > 0)
    {
        std::vector<uint64_t> nids;

        SuccessOrExit(value = ValidateMultiNetworkSyntax(retExpr, nids));
        if (IsMultiJob(retExpr)) // asynchronous processing required
        {
            SuccessOrExit(value = mJobManager->PrepareJobs(retExpr, nids, mContext.HasGroupAlias()));
            mJobManager->RunJobs();
            value = mJobManager->CollectJobsValue();
        }
        else // synchronous processing possible
        {
            // with multi-network syntax in effect an import semantics
            // is allowed for job-based processing only (see mImportSyntax)
            VerifyOrExit(mContext.mImportFiles.size() == 0,
                         value = ERROR_INVALID_ARGS(
                             "Import syntax is not supported in synchronous processing of multi-network command"));

            value = evaluator->second(this, retExpr);
        }
    }
    else
    {
        // handle single command using selected network
        if (mContext.mImportFiles.size() > 0)
        {
            uint64_t xpan = 0;
            if (mContext.mNwkAliases.empty())
            {
                auto result = mRegistry->GetCurrentNetworkXpan(xpan);
                if (result != Registry::Status::kSuccess)
                {
                    xpan = 0;
                }
            }
            else
            {
                std::vector<uint64_t> nwks;
                StringArray           unresolved;
                VerifyOrExit(mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, nwks, unresolved) ==
                                 Registry::Status::kSuccess,
                             value = ERROR_INVALID_ARGS("Failed to resolve network alias for import"));
                xpan = nwks[0];
            }
            SuccessOrExit(value = mJobManager->AppendImport(xpan, retExpr));
        }
        value = evaluator->second(this, retExpr);
    }
exit:
    // It is necessary to cleanup import file anyways
    mJobManager->CleanupJobs();
    return value;
}